

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

uint8_t * __thiscall
edition_unittest::TestRequiredOneof::_InternalSerialize
          (TestRequiredOneof *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  TestRequiredOneof_NestedMessage *pTVar1;
  bool bVar2;
  FooCase FVar3;
  int32_t value;
  int iVar4;
  WireFormatLite *this_00;
  size_type sVar5;
  UnknownFieldSet *unknown_fields;
  char *in_R9;
  string_view field_name;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined1 local_40 [8];
  string_view _s;
  uint32_t cached_has_bits;
  TestRequiredOneof *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestRequiredOneof *this_local;
  
  _s._M_str._4_4_ = 0;
  FVar3 = foo_case(this);
  stream_local = (EpsCopyOutputStream *)target;
  switch(FVar3) {
  case kFooInt:
    value = _internal_foo_int(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                             (stream,value,target);
    break;
  case kFooString:
    _local_40 = _internal_foo_string(this);
    this_00 = (WireFormatLite *)
              std::basic_string_view<char,_std::char_traits<char>_>::data
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_40);
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_40);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_50,"edition_unittest.TestRequiredOneof.foo_string");
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)local_50._M_str;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (this_00,(char *)(sVar5 & 0xffffffff),1,(Operation)local_50._M_len,field_name);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,2,_local_40,target);
    break;
  case kFooMessage:
    pTVar1 = (this->field_0)._impl_.foo_.foo_message_;
    iVar4 = TestRequiredOneof_NestedMessage::GetCachedSize((this->field_0)._impl_.foo_.foo_message_)
    ;
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (3,(MessageLite *)pTVar1,iVar4,target,stream);
    break;
  case kFooLazyMessage:
    pTVar1 = (this->field_0)._impl_.foo_.foo_message_;
    iVar4 = TestRequiredOneof_NestedMessage::GetCachedSize((this->field_0)._impl_.foo_.foo_message_)
    ;
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (4,(MessageLite *)pTVar1,iVar4,target,stream);
  }
  bVar2 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar2) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestRequiredOneof::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestRequiredOneof& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestRequiredOneof)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  switch (this_.foo_case()) {
    case kFooInt: {
      target =
          ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
              stream, this_._internal_foo_int(), target);
      break;
    }
    case kFooString: {
      const ::absl::string_view _s = this_._internal_foo_string();
      ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestRequiredOneof.foo_string");
      target = stream->WriteStringMaybeAliased(2, _s, target);
      break;
    }
    case kFooMessage: {
      target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
          3, *this_._impl_.foo_.foo_message_, this_._impl_.foo_.foo_message_->GetCachedSize(), target,
          stream);
      break;
    }
    case kFooLazyMessage: {
      target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
          4, *this_._impl_.foo_.foo_lazy_message_, this_._impl_.foo_.foo_lazy_message_->GetCachedSize(), target,
          stream);
      break;
    }
    default:
      break;
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestRequiredOneof)
  return target;
}